

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O0

int aom_satd_avx2(tran_low_t *coeff,int length)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  int in_ESI;
  undefined1 (*in_RDI) [32];
  undefined1 auVar3 [32];
  __m128i accum_128;
  __m256i d;
  __m256i c;
  __m256i b;
  __m256i a;
  __m256i abs;
  __m256i src_line;
  int i;
  __m256i accum;
  int local_224;
  undefined1 local_220 [32];
  undefined1 (*local_1f0) [32];
  int local_50;
  
  local_220 = ZEXT1632(ZEXT816(0));
  local_1f0 = in_RDI;
  for (local_224 = 0; local_224 < in_ESI; local_224 = local_224 + 8) {
    auVar3 = vpabsd_avx2(*local_1f0);
    local_220 = vpaddd_avx2(local_220,auVar3);
    local_1f0 = local_1f0 + 1;
  }
  auVar3 = vpsrldq_avx2(local_220,8);
  auVar3 = vpaddd_avx2(local_220,auVar3);
  auVar2 = vpsrlq_avx2(auVar3,ZEXT416(0x20));
  auVar3 = vpaddd_avx2(auVar3,auVar2);
  auVar1 = vpaddd_avx(auVar3._0_16_,auVar3._16_16_);
  local_50 = auVar1._0_4_;
  return local_50;
}

Assistant:

int aom_satd_avx2(const tran_low_t *coeff, int length) {
  __m256i accum = _mm256_setzero_si256();
  int i;

  for (i = 0; i < length; i += 8, coeff += 8) {
    const __m256i src_line = _mm256_loadu_si256((const __m256i *)coeff);
    const __m256i abs = _mm256_abs_epi32(src_line);
    accum = _mm256_add_epi32(accum, abs);
  }

  {  // 32 bit horizontal add
    const __m256i a = _mm256_srli_si256(accum, 8);
    const __m256i b = _mm256_add_epi32(accum, a);
    const __m256i c = _mm256_srli_epi64(b, 32);
    const __m256i d = _mm256_add_epi32(b, c);
    const __m128i accum_128 = _mm_add_epi32(_mm256_castsi256_si128(d),
                                            _mm256_extractf128_si256(d, 1));
    return _mm_cvtsi128_si32(accum_128);
  }
}